

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O3

int Gia_ManRexNumInputs(char *pStr,Vec_Int_t **pvAlphas,Vec_Int_t **pvStr2Sta)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  sVar3 = strlen(pStr);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  uVar2 = (uint)sVar3;
  iVar7 = uVar2 + 1;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < uVar2) {
    iVar9 = iVar7;
  }
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar5->pArray = piVar4;
  pVVar5->nSize = iVar7;
  memset(piVar4,0xff,(long)iVar7 * 4);
  if ((int)uVar2 < 1) {
    if ((int)uVar2 < 0) {
LAB_007128fb:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    uVar8 = 0;
    iVar9 = 0;
  }
  else {
    uVar8 = 0;
    iVar9 = 0;
    do {
      bVar1 = pStr[uVar8];
      if ((2 < bVar1 - 0x28) && (bVar1 != 0x7c)) {
        if (0 < (long)p->nSize) {
          lVar6 = 0;
          do {
            if (p->pArray[lVar6] == (int)(char)bVar1) goto LAB_007128a8;
            lVar6 = lVar6 + 1;
          } while (p->nSize != lVar6);
        }
        Vec_IntPush(p,(int)(char)bVar1);
LAB_007128a8:
        if ((long)iVar7 <= (long)uVar8) goto LAB_007128fb;
        piVar4[uVar8] = iVar9;
        iVar9 = iVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar2 & 0x7fffffff));
    uVar8 = (ulong)(uVar2 & 0x7fffffff);
  }
  piVar4[uVar8] = iVar9;
  *pvAlphas = p;
  *pvStr2Sta = pVVar5;
  return iVar9;
}

Assistant:

int Gia_ManRexNumInputs( char * pStr, Vec_Int_t ** pvAlphas, Vec_Int_t ** pvStr2Sta )
{
    int i, nStates = 0, Length = strlen(pStr);
    Vec_Int_t * vAlphas  = Vec_IntAlloc( 100 );            // alphabet
    Vec_Int_t * vStr2Sta = Vec_IntStartFull( Length + 1 ); // symbol to state
    for ( i = 0; i < Length; i++ )
    {
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        if ( Vec_IntFind(vAlphas, pStr[i]) == -1 )
            Vec_IntPush( vAlphas, pStr[i] );
        Vec_IntWriteEntry( vStr2Sta, i, nStates++ );
    }
    Vec_IntWriteEntry( vStr2Sta, i, nStates );
    *pvAlphas  = vAlphas;
    *pvStr2Sta = vStr2Sta;
    return nStates;
}